

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings_p.h
# Opt level: O2

QString * __thiscall QSettingsGroup::toString(QString *__return_storage_ptr__,QSettingsGroup *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QString::operator=(__return_storage_ptr__,&this->str);
  if (0 < this->num) {
    QString::append(__return_storage_ptr__,(QChar)0x2f);
    QString::number((QString *)&local_30,this->num,10);
    QString::append(__return_storage_ptr__,(QString *)&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QString QSettingsGroup::toString() const
{
    QString result;
    result = str;
    if (num > 0) {
        result += u'/';
        result += QString::number(num);
    }
    return result;
}